

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9GenQbf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  char *local_48;
  
  local_48 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_4c = 6;
  local_50 = 1;
  local_58 = 0;
  local_54 = 0;
  uVar2 = 1;
LAB_0028e210:
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"FKNSovh");
      iVar8 = globalUtilOptind;
      if (iVar1 == 0x46) {
        if (globalUtilOptind < argc) {
          uVar2 = atoi(argv[globalUtilOptind]);
          uVar3 = uVar2;
          goto joined_r0x0028e315;
        }
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0028e397;
      }
      if (0x52 < iVar1) break;
      if (iVar1 == -1) {
        pGVar5 = pAbc->pGia;
        if (pGVar5 == (Gia_Man_t *)0x0) {
          pcVar6 = "There is no current GIA.\n";
        }
        else if (pGVar5->nRegs == 0) {
          pcVar6 = "Works only for sequential networks.\n";
        }
        else {
          if (pGVar5->nRegs < (int)(local_4c * local_50)) {
            Abc_Print(-1,"The number of flops (%d) is less than required (%d).\n");
            return 1;
          }
          if ((uVar2 == 1) && (local_50 == 1)) {
            pGVar5 = Gia_GenQbfMiter(pGVar5,1,1,local_4c,local_48,local_58,local_54);
            Abc_FrameUpdateGia(pAbc,pGVar5);
            if (local_48 != (char *)0x0) {
              free(local_48);
              return 0;
            }
            return 0;
          }
          pcVar6 = "Currently this commands works for one frame and one LUT.\n";
        }
        iVar8 = -1;
        goto LAB_0028e465;
      }
      if (iVar1 == 0x4b) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-K\" should be followed by an integer.\n";
          goto LAB_0028e397;
        }
        local_4c = atoi(argv[globalUtilOptind]);
        uVar3 = local_4c;
      }
      else {
        if (iVar1 != 0x4e) goto LAB_0028e3a3;
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_0028e397:
          Abc_Print(-1,pcVar6);
          goto LAB_0028e3a3;
        }
        local_50 = atoi(argv[globalUtilOptind]);
        uVar3 = local_50;
      }
joined_r0x0028e315:
      globalUtilOptind = iVar8 + 1;
      if ((int)uVar3 < 0) goto LAB_0028e3a3;
    }
    if (iVar1 != 0x53) {
      if (iVar1 == 0x6f) {
        local_58 = local_58 ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0028e3a3;
        local_54 = local_54 ^ 1;
      }
      goto LAB_0028e210;
    }
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-S\" should be followed by a string.\n";
      goto LAB_0028e397;
    }
    pcVar6 = argv[globalUtilOptind];
    if (pcVar6 == (char *)0x0) {
      local_48 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar6);
      local_48 = (char *)malloc(sVar4 + 1);
      strcpy(local_48,pcVar6);
    }
    globalUtilOptind = iVar8 + 1;
    if (local_48 == (char *)0x0) {
LAB_0028e3a3:
      Abc_Print(-2,"usage: &genqbf [-FKN num] [-ovh]\n");
      Abc_Print(-2,"\t         generates QBF miter for computing an inductive invariant\n");
      Abc_Print(-2,"\t-F num : the number of time frames for induction [default = %d]\n",
                (ulong)uVar2);
      Abc_Print(-2,"\t-K num : the LUT size [default = %d]\n",(ulong)local_4c);
      Abc_Print(-2,"\t-N num : the number of LUTs [default = %d]\n",(ulong)local_50);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_58 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle using the last output [default = %s]\n",pcVar6);
      if (local_54 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar8 = -2;
LAB_0028e465:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GenQbf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_GenQbfMiter( Gia_Man_t * pGia, int nFrames, int nLutNum, int nLutSize, char * pStr, int fUseOut, int fVerbose );
    int nFrames   =    1;
    int nLutNum   =    1;
    int nLutSize  =    6;
    char * pStr   = NULL;
    int fUseOut   =    0;
    int fVerbose  =    0;
    int c;
    Gia_Man_t * pTemp;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FKNSovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutNum < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a string.\n" );
                goto usage;
            }
            pStr = Abc_UtilStrsav(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pStr == NULL )
                goto usage;
            break;
        case 'o':
            fUseOut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Works only for sequential networks.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) < nLutSize * nLutNum )
    {
        Abc_Print( -1, "The number of flops (%d) is less than required (%d).\n", Gia_ManRegNum(pAbc->pGia), nLutSize * nLutNum );
        return 1;
    }
    if ( nFrames != 1 || nLutNum != 1 )
    {
        Abc_Print( -1, "Currently this commands works for one frame and one LUT.\n" );
        return 1;
    }
    pTemp = Gia_GenQbfMiter( pAbc->pGia, nFrames, nLutNum, nLutSize, pStr, fUseOut, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    ABC_FREE( pStr );
    return 0;

usage:
    Abc_Print( -2, "usage: &genqbf [-FKN num] [-ovh]\n" );
    Abc_Print( -2, "\t         generates QBF miter for computing an inductive invariant\n" );
    Abc_Print( -2, "\t-F num : the number of time frames for induction [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-K num : the LUT size [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-N num : the number of LUTs [default = %d]\n", nLutNum );
    Abc_Print( -2, "\t-o     : toggle using the last output [default = %s]\n", fUseOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}